

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

void __thiscall
mjs::test_spec_runner::check_test_spec_done(test_spec_runner *this,uint32_t check_pos)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference extend;
  element_type *this_00;
  const_reference pvVar4;
  wostream *pwVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar6;
  value *v;
  value *v_00;
  value *v_01;
  wstring local_410 [32];
  wstring_view local_3f0;
  wstring_view local_3e0;
  wstring local_3d0;
  wstring local_3b0;
  wostringstream local_390 [8];
  wostringstream oss_1;
  wstring local_218 [32];
  wstring_view local_1f8;
  wstring_view local_1e8;
  wstring local_1d8;
  wstring_view local_1a8;
  wostringstream local_198 [8];
  wostringstream oss;
  value_type *s;
  uint32_t check_pos_local;
  test_spec_runner *this_local;
  
  sVar1 = this->index_;
  sVar3 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::size(this->specs_);
  if ((sVar1 != sVar3) &&
     (extend = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::operator[]
                         (this->specs_,this->index_), extend->position < check_pos)) {
    bVar2 = completion::operator_cast_to_bool(&this->last_result_);
    if ((bVar2) && ((this->last_result_).type != return_)) {
      std::__cxx11::wostringstream::wostringstream(local_198);
      this_00 = std::__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->source_);
      local_1a8 = source_file::filename(this_00);
      pbVar6 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,
                               local_1a8);
      pwVar5 = std::operator<<(pbVar6," failed: ");
      pwVar5 = mjs::operator<<(pwVar5,&(this->last_result_).type);
      pwVar5 = std::operator<<(pwVar5," ");
      debug_string_abi_cxx11_(&local_1d8,(mjs *)&(this->last_result_).result,v);
      pwVar5 = std::operator<<(pwVar5,(wstring *)&local_1d8);
      pwVar5 = std::operator<<(pwVar5," at ");
      pbVar6 = mjs::operator<<(pwVar5,&extend->extend);
      pwVar5 = std::operator<<(pbVar6,"\n");
      local_1e8 = source_extend::source_view(&extend->extend);
      std::operator<<(pwVar5,local_1e8);
      std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
      std::__cxx11::wostringstream::str();
      local_1f8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_218)
      ;
      throw_runtime_error(&local_1f8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd3);
    }
    pvVar4 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::operator[]
                       (this->specs_,this->index_);
    bVar2 = mjs::operator!=(&(this->last_result_).result,&pvVar4->expected);
    if (bVar2) {
      std::__cxx11::wostringstream::wostringstream(local_390);
      pwVar5 = std::operator<<((wostream *)local_390,"Expecting\n");
      pvVar4 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::operator[]
                         (this->specs_,this->index_);
      debug_string_abi_cxx11_(&local_3b0,(mjs *)&pvVar4->expected,v_00);
      pwVar5 = std::operator<<(pwVar5,(wstring *)&local_3b0);
      pwVar5 = std::operator<<(pwVar5,"\ngot\n");
      debug_string_abi_cxx11_(&local_3d0,(mjs *)&(this->last_result_).result,v_01);
      pwVar5 = std::operator<<(pwVar5,(wstring *)&local_3d0);
      pwVar5 = std::operator<<(pwVar5,"\nat ");
      pbVar6 = mjs::operator<<(pwVar5,&extend->extend);
      pwVar5 = std::operator<<(pbVar6,"\n");
      local_3e0 = source_extend::source_view(&extend->extend);
      std::operator<<(pwVar5,local_3e0);
      std::__cxx11::wstring::~wstring((wstring *)&local_3d0);
      std::__cxx11::wstring::~wstring((wstring *)&local_3b0);
      std::__cxx11::wostringstream::str();
      local_3f0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_410)
      ;
      throw_runtime_error(&local_3f0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd8);
    }
    this->index_ = this->index_ + 1;
  }
  return;
}

Assistant:

void check_test_spec_done(uint32_t check_pos) {
        if (index_ == specs_.size()) {
            return;
        }
        const auto& s = specs_[index_];

        if (check_pos > s.position) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << check_pos << ": Checking pos " << pos_w << s.position << " at " << s.extend << " expecting " << debug_string(s.expected) << "\n";
#endif
            if (last_result_ && last_result_.type != completion_type::return_) { // Allow return for the sake of function expressions
                std::wostringstream oss;
                oss << source_->filename() << " failed: " << last_result_.type << " " << debug_string(last_result_.result) << " at " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            if (last_result_.result != specs_[index_].expected) {
                std::wostringstream oss;
                oss << "Expecting\n" << debug_string(specs_[index_].expected) << "\ngot\n" << debug_string(last_result_.result) << "\nat " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            ++index_;
        }
    }